

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O2

int Tas_ManSolveArray(Tas_Man_t *p,Vec_Ptr_t *vObjs)

{
  int *piVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  uint uVar6;
  
  s_Counter2 = 0;
  s_Counter3 = 0;
  s_Counter4 = 0;
  p->vModel->nSize = 0;
  iVar5 = 0;
  while (iVar3 = vObjs->nSize, iVar5 < iVar3) {
    pGVar4 = (Gia_Obj_t *)Vec_PtrEntry(vObjs,iVar5);
    iVar5 = iVar5 + 1;
    if (pGVar4 == p->pAig->pObjs) {
      return 1;
    }
  }
  if (((p->pProp).iHead != 0) || ((p->pProp).iTail != 0)) {
    __assert_fail("!p->pProp.iHead && !p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCTas.c"
                  ,0x59a,"int Tas_ManSolveArray(Tas_Man_t *, Vec_Ptr_t *)");
  }
  if (((p->pJust).iHead != 0) || ((p->pJust).iTail != 0)) {
    __assert_fail("!p->pJust.iHead && !p->pJust.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCTas.c"
                  ,0x59b,"int Tas_ManSolveArray(Tas_Man_t *, Vec_Ptr_t *)");
  }
  if (((p->pClauses).iHead == 1) && ((p->pClauses).iTail == 1)) {
    (p->Pars).nJustThis = 0;
    (p->Pars).nBTThis = 0;
    (p->Pars).nBTThisNc = 0;
    for (iVar5 = 0; iVar5 < iVar3; iVar5 = iVar5 + 1) {
      pGVar4 = (Gia_Obj_t *)Vec_PtrEntry(vObjs,iVar5);
      if ((pGVar4 != (Gia_Obj_t *)((ulong)p->pAig->pObjs ^ 1)) &&
         ((*(byte *)(((ulong)pGVar4 & 0xfffffffffffffffe) + 3) & 0x40) == 0)) {
        Tas_ManAssign(p,pGVar4,0,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
      }
      iVar3 = vObjs->nSize;
    }
    iVar5 = Tas_ManSolve_rec(p,0);
    uVar6 = 1;
    if ((iVar5 == 0) && (iVar5 = Tas_ManCheckLimits(p), iVar5 == 0)) {
      Tas_ManSaveModel(p,p->vModel);
      uVar6 = 0;
    }
    Tas_ManCancelUntil(p,0);
    (p->pJust).iHead = 0;
    (p->pJust).iTail = 0;
    (p->pClauses).iHead = 1;
    (p->pClauses).iTail = 1;
    iVar5 = 0;
    if (0 < p->nClauses) {
      (p->pStore).iCur = 0x10;
      for (iVar5 = 0; pVVar2 = p->vWatchLits, iVar5 < pVVar2->nSize; iVar5 = iVar5 + 1) {
        iVar3 = Vec_IntEntry(pVVar2,iVar5);
        p->pWatches[iVar3] = 0;
      }
      pVVar2->nSize = 0;
      p->nClauses = 0;
      iVar5 = 0;
    }
    for (; pVVar2 = p->vActiveVars, iVar5 < pVVar2->nSize; iVar5 = iVar5 + 1) {
      iVar3 = Vec_IntEntry(pVVar2,iVar5);
      p->pActivity[iVar3] = 0.0;
    }
    pVVar2->nSize = 0;
    iVar5 = (p->Pars).nJustThis;
    piVar1 = &(p->Pars).nBTTotal;
    *piVar1 = *piVar1 + (p->Pars).nBTThis;
    iVar3 = (p->Pars).nJustTotal;
    if (iVar5 < iVar3) {
      iVar5 = iVar3;
    }
    (p->Pars).nJustTotal = iVar5;
    iVar5 = Tas_ManCheckLimits(p);
    return -(uint)(iVar5 != 0) | uVar6;
  }
  __assert_fail("p->pClauses.iHead == 1 && p->pClauses.iTail == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCTas.c"
                ,0x59c,"int Tas_ManSolveArray(Tas_Man_t *, Vec_Ptr_t *)");
}

Assistant:

int Tas_ManSolveArray( Tas_Man_t * p, Vec_Ptr_t * vObjs )
{
    Gia_Obj_t * pObj;
    int i, Entry, RetValue = 0;
    s_Counter2 = 0;
    s_Counter3 = 0;
    s_Counter4 = 0;
    Vec_IntClear( p->vModel );
    Vec_PtrForEachEntry( Gia_Obj_t *, vObjs, pObj, i )
        if ( pObj == Gia_ManConst0(p->pAig) )
            return 1;
    assert( !p->pProp.iHead && !p->pProp.iTail );
    assert( !p->pJust.iHead && !p->pJust.iTail );
    assert( p->pClauses.iHead == 1 && p->pClauses.iTail == 1 );
    p->Pars.nBTThis = p->Pars.nJustThis = p->Pars.nBTThisNc = 0;
    Vec_PtrForEachEntry( Gia_Obj_t *, vObjs, pObj, i )
        if ( pObj != Gia_ManConst1(p->pAig) && !Tas_VarIsAssigned(Gia_Regular(pObj)) )
            Tas_ManAssign( p, pObj, 0, NULL, NULL );
    if ( !Tas_ManSolve_rec(p, 0) && !Tas_ManCheckLimits(p) )
        Tas_ManSaveModel( p, p->vModel );
    else
        RetValue = 1;
    Tas_ManCancelUntil( p, 0 );
    p->pJust.iHead = p->pJust.iTail = 0;
    p->pClauses.iHead = p->pClauses.iTail = 1;
    // clauses
    if ( p->nClauses > 0 )
    {
        p->pStore.iCur = 16;
        Vec_IntForEachEntry( p->vWatchLits, Entry, i )
            p->pWatches[Entry] = 0;
        Vec_IntClear( p->vWatchLits );
        p->nClauses = 0;
    }
    // activity
    Vec_IntForEachEntry( p->vActiveVars, Entry, i )
        p->pActivity[Entry] = 0.0;
    Vec_IntClear( p->vActiveVars );
    // statistics
    p->Pars.nBTTotal += p->Pars.nBTThis;
    p->Pars.nJustTotal = Abc_MaxInt( p->Pars.nJustTotal, p->Pars.nJustThis );
    if ( Tas_ManCheckLimits( p ) )
        RetValue = -1;

//    printf( "%d ", Gia_ManObjNum(p->pAig) );
//    printf( "%d ", p->Pars.nBTThis );
//    printf( "%d ", p->Pars.nJustThis );
//    printf( "%d ", s_Counter2 );
//    printf( "%d ", s_Counter3 );
//    printf( "%d  ", s_Counter4 );
    return RetValue;
}